

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>_>::~TPZVec
          (TPZVec<std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>_> *this)

{
  vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *pvVar1;
  pointer pTVar2;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_018d5460;
  pvVar1 = this->fStore;
  if (pvVar1 != (vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)0x0) {
    pTVar2 = pvVar1[-1].super__Vector_base<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (pTVar2 != (pointer)0x0) {
      lVar3 = (long)pTVar2 * 0x18;
      do {
        std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>::~vector
                  ((vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)
                   ((long)&pvVar1[-1].
                           super__Vector_base<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != 0);
    }
    operator_delete__(&pvVar1[-1].super__Vector_base<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(long)pTVar2 * 0x18 + 8);
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	// If a positive value was requested, allocate it.
	if( size > 0 )
	{
		fStore = new T[ size ];
	}
	
	// Note that even 0 sized vectors are allowed.
	fNElements = size;
    fNAlloc = size;
    
}